

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPSolver.cpp
# Opt level: O2

void __thiscall MDPSolver::Print(MDPSolver *this)

{
  size_t sVar1;
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  size_t sVar3;
  ulong uVar4;
  long *plVar5;
  ostream *poVar6;
  Index sI;
  ulong uVar7;
  size_t t;
  ulong uVar8;
  Index jaI;
  uint uVar9;
  ulong uVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  string local_50 [32];
  
  sVar1 = (this->_m_pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  sVar3 = PlanningUnitMADPDiscrete::GetNrStates(&this->_m_pu->super_PlanningUnitMADPDiscrete);
  uVar4 = (**(code **)((long)*(this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  std::operator<<((ostream *)&std::cout,"States: ");
  for (uVar8 = 0; uVar8 < sVar3; uVar8 = (ulong)((int)uVar8 + 1)) {
    pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
    plVar5 = (long *)(**(code **)((long)*pMVar2 + 0x38))(pMVar2,uVar8);
    (**(code **)(*plVar5 + 0x18))(local_50,plVar5);
    poVar6 = std::operator<<((ostream *)&std::cout,local_50);
    std::operator<<(poVar6," ");
    std::__cxx11::string::~string(local_50);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  if (sVar1 == 999999) {
    for (uVar9 = 0; uVar8 = (ulong)uVar9, uVar8 < uVar4; uVar9 = uVar9 + 1) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Q(:,");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6,") =\t");
      uVar10 = 0;
      while( true ) {
        poVar6 = std::operator<<((ostream *)&std::cout," ");
        if (sVar3 <= uVar10) break;
        (*this->_vptr_MDPSolver[6])(this,uVar10,uVar8);
        std::ostream::_M_insert<double>(extraout_XMM0_Qa);
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
      plVar5 = (long *)(**(code **)((long)*pMVar2 + 0x80))(pMVar2,uVar8);
      (**(code **)(*plVar5 + 0x20))(local_50,plVar5);
      std::operator<<(poVar6,local_50);
      std::__cxx11::string::~string(local_50);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    std::operator<<((ostream *)&std::cout,"Policy: ");
    for (uVar8 = 0; uVar8 < sVar3; uVar8 = (ulong)((int)uVar8 + 1)) {
      pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
      plVar5 = (long *)(**(code **)((long)*pMVar2 + 0x38))(pMVar2,uVar8);
      (**(code **)(*plVar5 + 0x18))(local_50,plVar5);
      poVar6 = std::operator<<((ostream *)&std::cout,local_50);
      std::operator<<(poVar6,"->");
      std::__cxx11::string::~string(local_50);
      auVar11 = ZEXT816(0xffefffffffffffff);
      uVar10 = 0x7fffffff;
      uVar7 = 0;
      while( true ) {
        auVar12._0_8_ = auVar11._0_8_;
        if (uVar4 <= uVar7) break;
        (*this->_vptr_MDPSolver[6])(this,uVar8,uVar7);
        auVar12._8_8_ = 0;
        auVar11._8_8_ = extraout_XMM0_Qb;
        auVar11._0_8_ = extraout_XMM0_Qa_01;
        auVar11 = vmaxsd_avx(auVar11,auVar12);
        if (auVar12._0_8_ < extraout_XMM0_Qa_01) {
          uVar10 = uVar7;
        }
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
      plVar5 = (long *)(**(code **)((long)*pMVar2 + 0x80))(pMVar2,uVar10);
      (**(code **)(*plVar5 + 0x20))(local_50,plVar5);
      poVar6 = std::operator<<((ostream *)&std::cout,local_50);
      std::operator<<(poVar6," ");
      std::__cxx11::string::~string(local_50);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    for (uVar8 = 0; uVar8 != sVar1; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar10 = (ulong)uVar9, uVar10 < uVar4; uVar9 = uVar9 + 1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Q(t=");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6,",:,");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::operator<<(poVar6,") =\t");
        uVar7 = 0;
        while( true ) {
          poVar6 = std::operator<<((ostream *)&std::cout," ");
          if (sVar3 <= uVar7) break;
          (*this->_vptr_MDPSolver[5])(this,uVar8 & 0xffffffff,uVar7,uVar10);
          std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
          uVar7 = (ulong)((int)uVar7 + 1);
        }
        pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
        plVar5 = (long *)(**(code **)((long)*pMVar2 + 0x80))(pMVar2,uVar10);
        (**(code **)(*plVar5 + 0x20))(local_50,plVar5);
        std::operator<<(poVar6,local_50);
        std::__cxx11::string::~string(local_50);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
    }
  }
  return;
}

Assistant:

void MDPSolver::Print() const
{
    size_t horizon = GetPU()->GetHorizon();
    size_t nrS = GetPU()->GetNrStates();
    size_t nrJA =  GetPU()->GetNrJointActions();

    cout << "States: ";
    for(Index sI = 0; sI < nrS; sI++)
        cout << _m_pu->GetState(sI)->SoftPrintBrief() << " ";
    cout << endl;
        
    if(horizon!=MAXHORIZON)
    {
        for(size_t t = 0; t!=horizon; t++)
            for(Index jaI = 0; jaI < nrJA; jaI++)
            {            
                cout << "Q(t=" << t << ",:," << jaI << ") =\t";
                for(Index sI = 0; sI < nrS; sI++)
                    cout << " " << GetQ(t,sI,jaI);
                cout << " " << _m_pu->GetJointAction(jaI)->SoftPrintBrief();
                cout << endl;
            }
    }
    else
    {
        for(Index jaI = 0; jaI < nrJA; jaI++)
        {            
            cout << "Q(:," << jaI << ") =\t";
            for(Index sI = 0; sI < nrS; sI++)
                cout << " " << GetQ(sI,jaI);
            cout << " " << _m_pu->GetJointAction(jaI)->SoftPrintBrief();
            cout << endl;
        }
        
        cout << "Policy: ";
        for(Index sI = 0; sI < nrS; sI++)
        {
            cout << _m_pu->GetState(sI)->SoftPrintBrief() << "->";
            double q,v=-DBL_MAX;
            Index aMax=INT_MAX;

            for(Index jaI = 0; jaI < nrJA; jaI++)
            {
                q=GetQ(sI,jaI);
                if(q>v)
                {
                    v=q;
                    aMax=jaI;
                }
            }
            cout << _m_pu->GetJointAction(aMax)->SoftPrintBrief() << " ";
        }
        cout << endl;
    }
}